

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O2

object class_new(klass cls,char *name,constructor ctor,void **args,size_t argc)

{
  class_impl_interface_constructor p_Var1;
  object poVar2;
  
  if (((cls == (klass)0x0) || (cls->interface == (class_interface)0x0)) ||
     (p_Var1 = cls->interface->constructor, p_Var1 == (class_impl_interface_constructor)0x0)) {
    poVar2 = (object)0x0;
  }
  else {
    poVar2 = (*p_Var1)(cls,cls->impl,name,ctor,args,argc);
    if (poVar2 == (object)0x0) {
      poVar2 = (object)0x0;
      log_write_impl_va("metacall",0x1e0,"class_new",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                        ,LOG_LEVEL_ERROR,"Invalid class (%s) constructor <%p>",cls->name,
                        cls->interface->static_set);
    }
  }
  return poVar2;
}

Assistant:

object class_new(klass cls, const char *name, constructor ctor, class_args args, size_t argc)
{
	if (cls != NULL && cls->interface != NULL && cls->interface->constructor != NULL)
	{
		object obj = cls->interface->constructor(cls, cls->impl, name, ctor, args, argc);

		if (obj == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid class (%s) constructor <%p>", cls->name, cls->interface->static_set);

			return NULL;
		}

		return obj;
	}

	return NULL;
}